

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-port.cc
# Opt level: O1

string * __thiscall
testing::internal::FlagToEnvVar_abi_cxx11_(string *__return_storage_ptr__,internal *this,char *flag)

{
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ss;
  int iVar1;
  size_type sVar2;
  size_t sVar3;
  ostream *poVar4;
  Message env_var;
  string full_flag;
  char local_51;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_50;
  string local_48;
  
  Message::Message((Message *)&local_50);
  ss._M_head_impl = local_50._M_head_impl;
  poVar4 = (ostream *)(local_50._M_head_impl + 0x10);
  sVar3 = 6;
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"gtest_",6);
  if (this == (internal *)0x0) {
    this = (internal *)"(null)";
  }
  else {
    sVar3 = strlen((char *)this);
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,(char *)this,sVar3);
  StringStreamToString(&local_48,ss._M_head_impl);
  if (ss._M_head_impl != (stringstream *)0x0) {
    (**(code **)(*(long *)ss._M_head_impl + 8))(ss._M_head_impl);
  }
  Message::Message((Message *)&local_50);
  if (local_48._M_string_length != 0) {
    poVar4 = (ostream *)(local_50._M_head_impl + 0x10);
    sVar2 = 0;
    do {
      iVar1 = toupper((uint)(byte)local_48._M_dataplus._M_p[sVar2]);
      local_51 = (char)iVar1;
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,&local_51,1);
      sVar2 = sVar2 + 1;
    } while (sVar2 != local_48._M_string_length);
  }
  StringStreamToString(__return_storage_ptr__,local_50._M_head_impl);
  if (local_50._M_head_impl != (stringstream *)0x0) {
    (**(code **)(*(long *)local_50._M_head_impl + 8))(local_50._M_head_impl);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

static std::string FlagToEnvVar(const char* flag) {
  const std::string full_flag =
      (Message() << GTEST_FLAG_PREFIX_ << flag).GetString();

  Message env_var;
  for (size_t i = 0; i != full_flag.length(); i++) {
    env_var << ToUpper(full_flag.c_str()[i]);
  }

  return env_var.GetString();
}